

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

ostream * rtosc::operator<<(ostream *o,OscDocFormatter *formatter)

{
  ostream *poVar1;
  char buffer [1024];
  
  std::__ostream_insert<char,std::char_traits<char>>
            (o,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(o,"<osc_unit format_version=\"1.0\">\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>(o," <meta>\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(o,"  <name>",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(formatter->prog_name)._M_dataplus._M_p,
                      (formatter->prog_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</name>\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(o,"  <uri>",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(formatter->uri)._M_dataplus._M_p,(formatter->uri)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</uri>\n",7);
  std::__ostream_insert<char,std::char_traits<char>>(o,"  <doc_origin>",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(formatter->doc_origin)._M_dataplus._M_p,
                      (formatter->doc_origin)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</doc_origin>\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(o,"  <author><firstname>",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,(formatter->author_first)._M_dataplus._M_p,(formatter->author_first)._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>(o,"</firstname><lastname>",0x16);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(formatter->author_last)._M_dataplus._M_p,
                      (formatter->author_last)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</lastname></author>\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>(o," </meta>\n",9);
  memset(buffer,0,0x400);
  walk_ports(formatter->p,buffer,0x400,o,dump_ports_cb,false,(void *)0x0,true);
  std::__ostream_insert<char,std::char_traits<char>>(o,"</osc_unit>\n",0xc);
  return o;
}

Assistant:

std::ostream &rtosc::operator<<(std::ostream &o, rtosc::OscDocFormatter &formatter)
{
    o << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
    o << "<osc_unit format_version=\"1.0\">\n";
    o << " <meta>\n";
    o << "  <name>" << formatter.prog_name << "</name>\n";
    o << "  <uri>" << formatter.uri << "</uri>\n";
    o << "  <doc_origin>" << formatter.doc_origin << "</doc_origin>\n";
    o << "  <author><firstname>" << formatter.author_first;
    o << "</firstname><lastname>" << formatter.author_last << "</lastname></author>\n";
    o << " </meta>\n";
    char buffer[1024];
    memset(buffer, 0, sizeof(buffer));
    walk_ports(formatter.p, buffer, 1024, &o, dump_ports_cb, false, nullptr, true);
    o << "</osc_unit>\n";
    return o;
}